

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-engine.cpp
# Opt level: O1

void __thiscall gepard::GepardEngine::rect(GepardEngine *this,Float x,Float y,Float w,Float h)

{
  PathData *pPVar1;
  FloatPoint local_28;
  
  pPVar1 = (this->_context).path._pathData;
  FloatPoint::FloatPoint(&local_28,x,y);
  PathData::addMoveToElement(pPVar1,local_28);
  pPVar1 = (this->_context).path._pathData;
  FloatPoint::FloatPoint(&local_28,w + x,y);
  PathData::addLineToElement(pPVar1,local_28);
  pPVar1 = (this->_context).path._pathData;
  FloatPoint::FloatPoint(&local_28,w + x,h + y);
  PathData::addLineToElement(pPVar1,local_28);
  pPVar1 = (this->_context).path._pathData;
  FloatPoint::FloatPoint(&local_28,x,h + y);
  PathData::addLineToElement(pPVar1,local_28);
  PathData::addCloseSubpathElement((this->_context).path._pathData);
  return;
}

Assistant:

void GepardEngine::rect(Float x, Float y, Float w, Float h)
{
    moveTo(x, y);
    lineTo(x + w, y);
    lineTo(x + w, y + h);
    lineTo(x, y + h);
    closePath();
}